

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O0

WasmSplitOptions * __thiscall
wasm::WasmSplitOptions::add
          (WasmSplitOptions *this,string *longName,string *shortName,string *description,
          string *category,
          vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *modes
          ,Arguments arguments,Action *action)

{
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *pvVar1;
  string *psVar2;
  string *psVar3;
  bool bVar4;
  size_type sVar5;
  reference pMVar6;
  reference this_00;
  ostream *o;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  anon_class_72_3_0e06e9ed local_2b0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_268;
  string local_248 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_228;
  undefined1 local_220;
  Mode local_214;
  iterator iStack_210;
  Mode m;
  iterator __end2;
  iterator __begin2;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *__range2;
  string local_1f0 [8];
  string sep;
  stringstream local_1c0 [8];
  stringstream desc;
  ostream local_1b0 [376];
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *local_38;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *modes_local;
  string *category_local;
  string *description_local;
  string *shortName_local;
  string *longName_local;
  WasmSplitOptions *this_local;
  
  local_38 = modes;
  modes_local = (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                 *)category;
  category_local = description;
  description_local = shortName;
  shortName_local = longName;
  longName_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1c0);
  sVar5 = std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
          size(local_38);
  if (sVar5 != 0) {
    std::operator<<(local_1b0,'[');
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1f0,"",(allocator<char> *)((long)&__range2 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    pvVar1 = local_38;
    __end2 = std::
             vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
             begin(local_38);
    iStack_210 = std::
                 vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                 ::end(pvVar1);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffdf0);
      if (!bVar4) break;
      pMVar6 = __gnu_cxx::
               __normal_iterator<wasm::WasmSplitOptions::Mode_*,_std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>_>
               ::operator*(&__end2);
      local_214 = *pMVar6;
      this_00 = std::
                array<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                ::operator[](&this->validOptions,(ulong)local_214);
      pVar7 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(this_00,shortName_local);
      local_228._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_220 = pVar7.second;
      o = std::operator<<(local_1b0,local_1f0);
      anon_unknown_12::operator<<(o,&local_214);
      std::__cxx11::string::operator=(local_1f0,", ");
      __gnu_cxx::
      __normal_iterator<wasm::WasmSplitOptions::Mode_*,_std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>_>
      ::operator++(&__end2);
    }
    std::operator<<(local_1b0,"] ");
    std::__cxx11::string::~string(local_1f0);
  }
  std::operator<<(local_1b0,(string *)category_local);
  psVar3 = shortName_local;
  psVar2 = description_local;
  std::__cxx11::stringstream::str();
  pvVar1 = modes_local;
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_2b0.action,action);
  std::__cxx11::string::string((string *)&local_2b0.longName,(string *)shortName_local);
  local_2b0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::add(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<wasm::WasmSplitOptions::Mode,std::allocator<wasm::WasmSplitOptions::Mode>>&&,wasm::Options::Arguments,std::function<void(wasm::Options*,std::__cxx11::string_const&)>const&)::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_268,&local_2b0);
  ::wasm::Options::add
            ((string *)this,(string *)psVar3,(string *)psVar2,local_248,(Arguments)pvVar1,
             (function *)(ulong)arguments,SUB81(&local_268,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_268);
  add(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<wasm::WasmSplitOptions::Mode,std::allocator<wasm::WasmSplitOptions::Mode>>&&,wasm::Options::Arguments,std::function<void(wasm::Options*,std::__cxx11::string_const&)>const&)
  ::$_0::~__0((__0 *)&local_2b0);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return this;
}

Assistant:

WasmSplitOptions& WasmSplitOptions::add(const std::string& longName,
                                        const std::string& shortName,
                                        const std::string& description,
                                        const std::string& category,
                                        std::vector<Mode>&& modes,
                                        Arguments arguments,
                                        const Action& action) {
  // Insert the valid modes at the beginning of the description.
  std::stringstream desc;
  if (modes.size()) {
    desc << '[';
    std::string sep = "";
    for (Mode m : modes) {
      validOptions[static_cast<unsigned>(m)].insert(longName);
      desc << sep << m;
      sep = ", ";
    }
    desc << "] ";
  }
  desc << description;
  ToolOptions::add(
    longName,
    shortName,
    desc.str(),
    category,
    arguments,
    [&, action, longName](Options* o, const std::string& argument) {
      usedOptions.push_back(longName);
      action(o, argument);
    });
  return *this;
}